

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Spline.H
# Opt level: O2

void __thiscall
amrex::EB2::SplineIF::addLineElement
          (SplineIF *this,vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  LineDistFcnElement2d *this_00;
  LineDistFcnElement2d *local_40;
  _Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_> local_38;
  
  this_00 = (LineDistFcnElement2d *)operator_new(0x38);
  (this_00->super_distFcnElement2d)._vptr_distFcnElement2d =
       (_func_int **)&PTR_newDistFcnElement2d_006db010;
  (this_00->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::vector
            ((vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *)&local_38,pts);
  LineDistFcnElement2d::set_control_points
            (this_00,(vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *)&local_38);
  std::_Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>::~_Vector_base(&local_38);
  local_40 = this_00;
  std::vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>>::
  emplace_back<amrex::distFcnElement2d*>
            ((vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>> *)this,
             (distFcnElement2d **)&local_40);
  return;
}

Assistant:

void addLineElement(std::vector<amrex::RealVect> pts) {
    LineDistFcnElement2d * theLine = new LineDistFcnElement2d();
    theLine->set_control_points(pts);
    geomElements.push_back(theLine);
  }